

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::concat<kj::_::Delimited<kj::ArrayPtr<unsigned_char>>,kj::StringPtr&,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,Delimited<kj::ArrayPtr<unsigned_char>_> *params,
          StringPtr *params_1,ArrayPtr<const_char> *params_2)

{
  uchar *__src;
  size_t __n;
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  size_t local_38 [3];
  
  local_38[0] = Delimited<kj::ArrayPtr<unsigned_char>_>::size
                          ((Delimited<kj::ArrayPtr<unsigned_char>_> *)this);
  local_38[1] = (params->array).size_ - 1;
  local_38[2] = (params_1->content).size_;
  sVar3 = 0;
  lVar1 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_38 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  heapString(__return_storage_ptr__,sVar3);
  pcVar2 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar2 != (char *)0x0) {
    pcVar2 = (__return_storage_ptr__->content).ptr;
  }
  pcVar2 = Delimited<kj::ArrayPtr<unsigned_char>_>::flattenTo
                     ((Delimited<kj::ArrayPtr<unsigned_char>_> *)this,pcVar2);
  __src = (params->array).ptr;
  sVar3 = (params->array).size_;
  if (__src != __src + (sVar3 - 1)) {
    memcpy(pcVar2,__src,sVar3 - 1);
    pcVar2 = pcVar2 + (sVar3 - 1);
  }
  __n = (params_1->content).size_;
  if (__n != 0) {
    memcpy(pcVar2,(params_1->content).ptr,__n);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}